

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.h
# Opt level: O0

Maybe<kj::Exception> * __thiscall
kj::runCatchingExceptions<capnp::_::OrphanBuilder::euthanize()::__0>
          (Maybe<kj::Exception> *__return_storage_ptr__,kj *this,anon_class_8_1_8991fb9c *func)

{
  anon_class_8_1_8991fb9c *func_local;
  
  capnp::_::OrphanBuilder::euthanize::anon_class_8_1_8991fb9c::operator()
            ((anon_class_8_1_8991fb9c *)this);
  Maybe<kj::Exception>::Maybe(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Maybe<Exception> runCatchingExceptions(Func&& func) {
  try {
    func();
    return kj::none;
  } catch (...) {
    return getCaughtExceptionAsKj();
  }
}